

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O3

float computeMeshVolume2(float *vertices,uint tcount,uint *indices)

{
  uint *puVar1;
  uint *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  
  if (tcount != 0) {
    fVar3 = *vertices;
    fVar4 = vertices[1];
    fVar5 = vertices[2];
    fVar11 = 0.0;
    do {
      puVar1 = indices + 1;
      puVar2 = indices + 2;
      uVar6 = *indices;
      indices = indices + 3;
      tcount = tcount - 1;
      uVar9 = (ulong)(*puVar1 * 3);
      uVar10 = (ulong)(*puVar2 * 3);
      uVar8 = (ulong)(uVar6 * 3);
      auVar7 = vfmsub231ss_fma(ZEXT416((uint)((vertices[uVar10 + 1] - fVar4) *
                                             (vertices[uVar9 + 2] - fVar5))),
                               ZEXT416((uint)(vertices[uVar9 + 1] - fVar4)),
                               ZEXT416((uint)(vertices[uVar10 + 2] - fVar5)));
      auVar12 = vfmsub231ss_fma(ZEXT416((uint)((vertices[uVar10 + 2] - fVar5) *
                                              (vertices[uVar9] - fVar3))),
                                ZEXT416((uint)(vertices[uVar10] - fVar3)),
                                ZEXT416((uint)(vertices[uVar9 + 2] - fVar5)));
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * (vertices[uVar8 + 1] - fVar4))),
                               ZEXT416((uint)(vertices[uVar8] - fVar3)),auVar7);
      auVar12 = vfmsub231ss_fma(ZEXT416((uint)((vertices[uVar10] - fVar3) *
                                              (vertices[uVar9 + 1] - fVar4))),
                                ZEXT416((uint)(vertices[uVar9] - fVar3)),
                                ZEXT416((uint)(vertices[uVar10 + 1] - fVar4)));
      auVar7 = vfmadd213ss_fma(auVar12,ZEXT416((uint)(vertices[uVar8 + 2] - fVar5)),auVar7);
      auVar12._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar12._8_4_ = auVar7._8_4_ ^ 0x80000000;
      auVar12._12_4_ = auVar7._12_4_ ^ 0x80000000;
      auVar7 = vmaxss_avx(auVar12,auVar7);
      fVar11 = fVar11 + auVar7._0_4_;
    } while (tcount != 0);
    return fVar11 * 0.16666667;
  }
  return 0.0;
}

Assistant:

float computeMeshVolume2(const float *vertices,unsigned int tcount,const unsigned int *indices)
{
	float volume = 0;

	const float *p0 = vertices;
	for (unsigned int i=0; i<tcount; i++,indices+=3)
	{

		const float *p1 = &vertices[ indices[0]*3 ];
		const float *p2 = &vertices[ indices[1]*3 ];
		const float *p3 = &vertices[ indices[2]*3 ];

		volume+=tetVolume(p0,p1,p2,p3); // compute the volume of the tetrahedron relative to the root vertice
	}

  return volume * (1.0f / 6.0f );
}